

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gemm_x86_avx2.cpp
# Opt level: O0

void ncnn::pack_B_tile_int8_avx2(Mat *B,Mat *BT,int j,int max_jj,int k,int max_kk)

{
  int in_stack_000000d8;
  int in_stack_000000dc;
  int in_stack_000000e0;
  int in_stack_000000e4;
  Mat *in_stack_000000e8;
  Mat *in_stack_000000f0;
  
  pack_B_tile_int8(in_stack_000000f0,in_stack_000000e8,in_stack_000000e4,in_stack_000000e0,
                   in_stack_000000dc,in_stack_000000d8);
  return;
}

Assistant:

void pack_B_tile_int8_avx2(const Mat& B, Mat& BT, int j, int max_jj, int k, int max_kk)
{
    pack_B_tile_int8(B, BT, j, max_jj, k, max_kk);
}